

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O0

optional<tinyusdz::ListOp<tinyusdz::Path>_> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::ListOp<tinyusdz::Path>>
          (optional<tinyusdz::ListOp<tinyusdz::Path>_> *__return_storage_ptr__,CrateValue *this)

{
  optional<tinyusdz::ListOp<tinyusdz::Path>_> local_b8;
  CrateValue *local_18;
  CrateValue *this_local;
  
  local_18 = this;
  this_local = (CrateValue *)__return_storage_ptr__;
  tinyusdz::value::Value::get_value<tinyusdz::ListOp<tinyusdz::Path>>(&local_b8,&this->value_,false)
  ;
  nonstd::optional_lite::optional<tinyusdz::ListOp<tinyusdz::Path>_>::
  optional<tinyusdz::ListOp<tinyusdz::Path>,_0>(__return_storage_ptr__,&local_b8);
  nonstd::optional_lite::optional<tinyusdz::ListOp<tinyusdz::Path>_>::~optional(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }